

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive.cpp
# Opt level: O0

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::AnimatedPrimitive::Intersect(AnimatedPrimitive *this,Ray *r,Float tMax)

{
  bool bVar1;
  undefined8 in_RSI;
  optional<pbrt::ShapeIntersection> *in_RDI;
  undefined4 in_XMM0_Da;
  type tVar2;
  int vb;
  type va;
  optional<pbrt::ShapeIntersection> si;
  Ray ray;
  Transform interpRenderFromPrimitive;
  SurfaceInteraction *in_stack_fffffffffffffc98;
  SurfaceInteraction *in_stack_fffffffffffffca0;
  optional<pbrt::ShapeIntersection> *in_stack_fffffffffffffca8;
  optional<pbrt::ShapeIntersection> *in_stack_fffffffffffffcb0;
  Float in_stack_fffffffffffffcbc;
  Ray *in_stack_fffffffffffffcc0;
  PrimitiveHandle *in_stack_fffffffffffffcc8;
  optional<pbrt::ShapeIntersection> *args;
  char *fmt;
  int line;
  char *file;
  optional *this_00;
  LogLevel level;
  float *in_stack_fffffffffffffd28;
  char (*in_stack_fffffffffffffd30) [2];
  int *in_stack_fffffffffffffd38;
  Float *in_stack_fffffffffffffd88;
  Ray *in_stack_fffffffffffffd90;
  Transform *in_stack_fffffffffffffd98;
  optional local_1d0 [208];
  SurfaceInteraction *in_stack_ffffffffffffff00;
  Transform *in_stack_ffffffffffffff08;
  char local_c8 [44];
  char local_9c [120];
  Float in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  line = (int)((ulong)in_RSI >> 0x20);
  fmt = local_9c;
  args = in_RDI;
  AnimatedTransform::Interpolate
            ((AnimatedTransform *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffdc);
  file = local_c8;
  Transform::ApplyInverse
            (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  this_00 = local_1d0;
  PrimitiveHandle::Intersect
            (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
  bVar1 = pstd::optional::operator_cast_to_bool(this_00);
  level = (LogLevel)((ulong)this_00 >> 0x20);
  if (bVar1) {
    pstd::optional<pbrt::ShapeIntersection>::operator->
              ((optional<pbrt::ShapeIntersection> *)0x8477bf);
    Transform::operator()(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    pstd::optional<pbrt::ShapeIntersection>::operator->
              ((optional<pbrt::ShapeIntersection> *)0x8477ef);
    SurfaceInteraction::operator=(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    pstd::optional<pbrt::ShapeIntersection>::operator->
              ((optional<pbrt::ShapeIntersection> *)0x847819);
    pstd::optional<pbrt::ShapeIntersection>::operator->
              ((optional<pbrt::ShapeIntersection> *)0x84783b);
    tVar2 = Dot<float>((Normal3<float> *)in_stack_fffffffffffffca0,
                       (Normal3<float> *)in_stack_fffffffffffffc98);
    if (tVar2 < 0.0) {
      LogFatal<char_const(&)[36],char_const(&)[2],char_const(&)[36],float&,char_const(&)[2],int&>
                (level,file,line,fmt,(char (*) [36])args,(char (*) [2])in_RDI,
                 (char (*) [36])((ulong)(uint)tVar2 << 0x20),in_stack_fffffffffffffd28,
                 in_stack_fffffffffffffd30,in_stack_fffffffffffffd38);
    }
    pstd::optional<pbrt::ShapeIntersection>::optional
              (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  }
  else {
    memset(in_RDI,0,0x108);
    pstd::optional<pbrt::ShapeIntersection>::optional(in_RDI);
  }
  pstd::optional<pbrt::ShapeIntersection>::~optional((optional<pbrt::ShapeIntersection> *)0x84790e);
  return args;
}

Assistant:

pstd::optional<ShapeIntersection> AnimatedPrimitive::Intersect(const Ray &r,
                                                               Float tMax) const {
    // Compute _ray_ after transformation by _renderFromPrimitive_
    Transform interpRenderFromPrimitive = renderFromPrimitive.Interpolate(r.time);
    Ray ray = interpRenderFromPrimitive.ApplyInverse(r, &tMax);
    pstd::optional<ShapeIntersection> si = primitive.Intersect(ray, tMax);
    if (!si)
        return {};

    // Transform instance's intersection data to render space
    si->intr = interpRenderFromPrimitive(si->intr);
    CHECK_GE(Dot(si->intr.n, si->intr.shading.n), 0);
    return si;
}